

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O1

void __thiscall
llm_tokenizer_rwkv_session::tokenize
          (llm_tokenizer_rwkv_session *this,string *text,vector<int,_std::allocator<int>_> *output)

{
  char cVar1;
  undefined1 uVar2;
  pointer pcVar3;
  iterator iVar4;
  undefined8 in_RAX;
  _Base_ptr p_Var5;
  _Base_ptr *pp_Var6;
  int iVar7;
  _Rb_tree_header *p_Var8;
  ulong uVar9;
  _Base_ptr p_Var10;
  ulong uVar11;
  undefined8 local_38;
  
  if (text->_M_string_length != 0) {
    uVar9 = 0;
    local_38 = in_RAX;
    do {
      pcVar3 = (text->_M_dataplus)._M_p;
      cVar1 = pcVar3[uVar9];
      p_Var8 = &(this->tokenizer->token_matcher).children._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (this->tokenizer->token_matcher).children._M_t._M_impl.super__Rb_tree_header.
               _M_header._M_parent;
      p_Var10 = &p_Var8->_M_header;
      for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[(char)uVar2 < cVar1]) {
        uVar2 = (undefined1)p_Var5[1]._M_color;
        if (cVar1 <= (char)uVar2) {
          p_Var10 = p_Var5;
        }
      }
      p_Var5 = &p_Var8->_M_header;
      if (((_Rb_tree_header *)p_Var10 != p_Var8) &&
         (p_Var5 = p_Var10, cVar1 < (char)p_Var10[1]._M_color)) {
        p_Var5 = &p_Var8->_M_header;
      }
      if ((_Rb_tree_header *)p_Var5 == p_Var8) {
        iVar7 = *(int *)((long)(this->vocab->pimpl)._M_t.
                               super___uniq_ptr_impl<llama_vocab::impl,_std::default_delete<llama_vocab::impl>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_llama_vocab::impl_*,_std::default_delete<llama_vocab::impl>_>
                               .super__Head_base<0UL,_llama_vocab::impl_*,_false> + 0x20);
        local_38 = CONCAT44(iVar7,(int)local_38);
        iVar4._M_current =
             (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
        if (iVar4._M_current ==
            (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          llama_vocab::std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (output,iVar4,(int *)((long)&local_38 + 4));
        }
        else {
          *iVar4._M_current = iVar7;
          (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar4._M_current + 1;
        }
        uVar9 = (ulong)((int)uVar9 + 1);
      }
      else {
        uVar11 = 0;
        iVar7 = 0;
        do {
          if (*(char *)&p_Var5[2]._M_right == '\x01') {
            iVar7 = *(int *)((long)&p_Var5[2]._M_right + 4);
            uVar11 = (ulong)((int)uVar9 + 1);
          }
          uVar9 = (ulong)((int)uVar9 + 1);
          cVar1 = pcVar3[uVar9];
          pp_Var6 = &p_Var5[1]._M_left;
          p_Var10 = (_Base_ptr)pp_Var6;
          for (p_Var5 = p_Var5[1]._M_right; p_Var5 != (_Base_ptr)0x0;
              p_Var5 = (&p_Var5->_M_left)[(char)uVar2 < cVar1]) {
            uVar2 = (undefined1)p_Var5[1]._M_color;
            if (cVar1 <= (char)uVar2) {
              p_Var10 = p_Var5;
            }
          }
          p_Var5 = (_Base_ptr)pp_Var6;
          if ((p_Var10 != (_Base_ptr)pp_Var6) &&
             (p_Var5 = p_Var10, cVar1 < (char)p_Var10[1]._M_color)) {
            p_Var5 = (_Base_ptr)pp_Var6;
          }
        } while (p_Var5 != (_Base_ptr)pp_Var6);
        local_38 = CONCAT44(local_38._4_4_,iVar7);
        iVar4._M_current =
             (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
        uVar9 = uVar11;
        if (iVar4._M_current ==
            (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          llama_vocab::std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (output,iVar4,(int *)&local_38);
        }
        else {
          *iVar4._M_current = iVar7;
          (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_finish = iVar4._M_current + 1;
        }
      }
    } while (uVar9 < text->_M_string_length);
  }
  return;
}

Assistant:

void tokenize(const std::string & text, std::vector<llama_token> & output) {
        uint32_t position = 0;
        while (position < text.size()) {
            const struct naive_trie * node = tokenizer.token_matcher.traverse(text[position]);
            if (node == NULL) {
                // no matching token found, add unknown token
                output.push_back(vocab.token_unk());
                position += 1;
                continue;
            }

            // traverse the trie to find the longest matching token
            uint32_t token_id = 0;
            uint32_t token_length = 0;
            while (node != NULL) {
                if (node->has_value) {
                    token_id = node->value;
                    token_length = position + 1;
                }
                node = node->traverse(text[++position]);
            }

            // add the longest matching token
            output.push_back(token_id);
            position = token_length;
        }
    }